

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_ge_to_storage(secp256k1_ge_storage *r,secp256k1_ge *a)

{
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_48.n[0] = (a->x).n[0];
  local_48.n[1] = (a->x).n[1];
  local_48.n[2] = (a->x).n[2];
  local_48.n[3] = (a->x).n[3];
  local_48.n[4] = (a->x).n[4];
  secp256k1_fe_impl_normalize(&local_48);
  local_78.n[4] = (a->y).n[4];
  local_78.n[0] = (a->y).n[0];
  local_78.n[1] = (a->y).n[1];
  local_78.n[2] = (a->y).n[2];
  local_78.n[3] = (a->y).n[3];
  secp256k1_fe_impl_normalize(&local_78);
  (r->x).n[0] = local_48.n[1] << 0x34 | local_48.n[0];
  (r->x).n[1] = local_48.n[2] << 0x28 | local_48.n[1] >> 0xc;
  (r->x).n[2] = local_48.n[3] << 0x1c | local_48.n[2] >> 0x18;
  (r->x).n[3] = local_48.n[4] << 0x10 | local_48.n[3] >> 0x24;
  (r->y).n[0] = local_78.n[1] << 0x34 | local_78.n[0];
  (r->y).n[1] = local_78.n[2] << 0x28 | local_78.n[1] >> 0xc;
  (r->y).n[2] = local_78.n[3] << 0x1c | local_78.n[2] >> 0x18;
  (r->y).n[3] = local_78.n[4] << 0x10 | local_78.n[3] >> 0x24;
  return;
}

Assistant:

static void secp256k1_ge_to_storage(secp256k1_ge_storage *r, const secp256k1_ge *a) {
    secp256k1_fe x, y;
    SECP256K1_GE_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    x = a->x;
    secp256k1_fe_normalize(&x);
    y = a->y;
    secp256k1_fe_normalize(&y);
    secp256k1_fe_to_storage(&r->x, &x);
    secp256k1_fe_to_storage(&r->y, &y);
}